

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

void __thiscall
MADPComponentFactoredStates::~MADPComponentFactoredStates(MADPComponentFactoredStates *this)

{
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  *this_00;
  _Base_ptr p_Var1;
  pointer puVar2;
  pointer puVar3;
  pointer ppSVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  this->_vptr_MADPComponentFactoredStates = (_func_int **)&PTR__MADPComponentFactoredStates_005e7630
  ;
  ppSVar4 = (this->_m_stateFactors).
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->_m_stateFactors).
                super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4;
  if (lVar5 != 0) {
    uVar6 = lVar5 >> 3;
    uVar7 = 1;
    uVar8 = 0;
    do {
      if (uVar6 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if (ppSVar4[uVar8] != (StateFactorDiscrete *)0x0) {
        (*(ppSVar4[uVar8]->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[1])();
      }
      uVar8 = (ulong)uVar7;
      ppSVar4 = (this->_m_stateFactors).
                super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->_m_stateFactors).
                    super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar8);
  }
  if (this->_m_initialStateDistribution != (FactoredStateDistribution *)0x0) {
    (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[1])();
  }
  while (this_00 = &this->_m_jointStatesMap->_M_t,
        (this_00->_M_impl).super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left[1]._M_right;
    if (p_Var1 != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1 + 8))();
    }
    std::
    _Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
                        *)this->_m_jointStatesMap,
                       *(_Base_ptr *)
                        ((_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
                          *)this->_m_jointStatesMap + 0x18));
  }
  if (this_00 !=
      (_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
       *)0x0) {
    std::
    _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00,0x30);
  }
  if (this->_m_stepSize != (size_t *)0x0) {
    operator_delete__(this->_m_stepSize);
  }
  puVar2 = (this->_m_allStateFactorScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_allStateFactorScope).super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  ppSVar4 = (this->_m_stateFactors).
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->_m_stateFactors).
                                  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  puVar3 = (this->_m_sfacDomainSizes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->_m_sfacDomainSizes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    return;
  }
  return;
}

Assistant:

MADPComponentFactoredStates::~MADPComponentFactoredStates()
{
    for(Index i=0;i!=_m_stateFactors.size();++i)
        delete _m_stateFactors.at(i);
    delete _m_initialStateDistribution;

    while( !_m_jointStatesMap->empty() )
    {
        delete (*_m_jointStatesMap->begin()).second;
        _m_jointStatesMap->erase( _m_jointStatesMap->begin() );
    }
    delete _m_jointStatesMap;
    delete [] _m_stepSize;
}